

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer>
             *this,back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> __result;
  __type _Var1;
  
  __result = (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)it->container;
  if (*(long *)(this + 0x10) != 0) {
    __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                         (*(char **)(this + 8),*(char **)(this + 8) + *(long *)(this + 0x10),
                          __result);
    it->container = (list<char,_std::allocator<char>_> *)__result;
  }
  _Var1 = std::
          __fill_n_a1<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,unsigned_long,char>
                    (__result,*(unsigned_long *)(this + 0x20),(char *)(this + 0x18));
  it->container = _Var1.container;
  int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
            ((num_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }